

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

pool_ptr<soul::AST::ModuleBase> __thiscall
soul::AST::Scope::findSubModuleNamed(Scope *this,Identifier name)

{
  pool_ref<soul::AST::ModuleBase> *m;
  long *plVar1;
  _func_int **pp_Var2;
  _func_int *in_RDX;
  undefined1 auVar3 [16];
  
  auVar3 = (**(code **)(((name.name)->_M_dataplus)._M_p + 0x88))(name.name);
  for (plVar1 = auVar3._0_8_; plVar1 != auVar3._8_8_; plVar1 = plVar1 + 1) {
    pp_Var2 = (_func_int **)*plVar1;
    if ((pp_Var2[8] == in_RDX) && (pp_Var2[10] == pp_Var2[0xb])) goto LAB_0020156e;
  }
  auVar3 = (**(code **)(((name.name)->_M_dataplus)._M_p + 0x80))(name.name);
  plVar1 = auVar3._0_8_;
  pp_Var2 = (_func_int **)0x0;
  do {
    if (plVar1 == auVar3._8_8_) {
LAB_0020156e:
      this->_vptr_Scope = pp_Var2;
      return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
    }
    if (*(_func_int **)(*plVar1 + 0x28) == in_RDX) {
      pp_Var2 = *(_func_int ***)(*plVar1 + 0x40);
      goto LAB_0020156e;
    }
    plVar1 = plVar1 + 1;
  } while( true );
}

Assistant:

pool_ptr<ModuleBase> findSubModuleNamed (Identifier name) const
        {
            for (auto& m : getSubModules())
                if (m->name == name && (! m->isTemplateModule()))
                    return m;

            for (auto& a : getNamespaceAliases())
                if (a->name == name)
                    return a->resolvedNamespace;

            return {};
        }